

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

void google::protobuf::anon_unknown_21::CollectEditions
               (Descriptor *descriptor,Edition maximum_edition,
               btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
               *editions)

{
  FieldOptions *pFVar1;
  FieldDescriptor *pFVar2;
  undefined1 *puVar3;
  void **ppvVar4;
  const_iterator cVar5;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this;
  int i;
  int index;
  
  for (index = 0; index < descriptor->field_count_; index = index + 1) {
    pFVar2 = Descriptor::field(descriptor,index);
    pFVar1 = pFVar2->options_;
    puVar3 = (undefined1 *)(pFVar1->field_0)._impl_.feature_support_;
    if ((FieldOptions_FeatureSupport *)puVar3 == (FieldOptions_FeatureSupport *)0x0) {
      puVar3 = _FieldOptions_FeatureSupport_default_instance_;
    }
    MaybeInsertEdition((((FieldOptions_FeatureSupport *)puVar3)->field_0)._impl_.edition_introduced_
                       ,maximum_edition,editions);
    puVar3 = (undefined1 *)(pFVar1->field_0)._impl_.feature_support_;
    if ((FieldOptions_FeatureSupport *)puVar3 == (FieldOptions_FeatureSupport *)0x0) {
      puVar3 = _FieldOptions_FeatureSupport_default_instance_;
    }
    if ((undefined1  [32])
        ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar3)->field_0 & (undefined1  [32])0x8)
        != (undefined1  [32])0x0) {
      MaybeInsertEdition((((FieldOptions_FeatureSupport *)puVar3)->field_0)._impl_.edition_removed_,
                         maximum_edition,editions);
    }
    this = &(pFVar1->field_0)._impl_.edition_defaults_;
    ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
    cVar5 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(this);
    for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
      MaybeInsertEdition(*(Edition *)((long)*ppvVar4 + 0x20),maximum_edition,editions);
    }
  }
  return;
}

Assistant:

void CollectEditions(const Descriptor& descriptor, Edition maximum_edition,
                     absl::btree_set<Edition>& editions) {
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldOptions& options = descriptor.field(i)->options();
    // Editions where a new feature is introduced should be captured.
    MaybeInsertEdition(options.feature_support().edition_introduced(),
                       maximum_edition, editions);

    // Editions where a feature is removed should be captured.
    if (options.feature_support().has_edition_removed()) {
      MaybeInsertEdition(options.feature_support().edition_removed(),
                         maximum_edition, editions);
    }

    // Any edition where a default value changes should be captured.
    for (const auto& def : options.edition_defaults()) {
      MaybeInsertEdition(def.edition(), maximum_edition, editions);
    }
  }
}